

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O2

void __thiscall HighsLpRelaxation::setIterationLimit(HighsLpRelaxation *this,HighsInt limit)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"simplex_iteration_limit",&local_39);
  Highs::setOptionValue(&this->lpsolver,&local_38,limit);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void setIterationLimit(HighsInt limit = kHighsIInf) {
    lpsolver.setOptionValue("simplex_iteration_limit", limit);
  }